

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O1

void __thiscall vector_block<int,_1024U>::~vector_block(vector_block<int,_1024U> *this)

{
  pointer ppiVar1;
  ulong uVar2;
  
  ppiVar1 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppiVar1) {
    uVar2 = 0;
    do {
      free(ppiVar1[uVar2]);
      uVar2 = uVar2 + 1;
      ppiVar1 = (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_index_block).
                                   super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppiVar1 >> 3));
  }
  if (ppiVar1 != (pointer)0x0) {
    operator_delete(ppiVar1);
    return;
  }
  return;
}

Assistant:

~vector_block()
	{
		for (size_t i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
	}